

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O2

void __thiscall PatternModel::moveCursorRow(PatternModel *this,int amount,SelectMode mode)

{
  if ((this->mPlaying != true) || (this->mFollowing == false)) {
    if (mode == SelectionModify) {
      selectCursor(this);
    }
    else if (mode == SelectionRemove) {
      deselect(this);
    }
    setCursorRow(this,amount + (this->mCursor).super_PatternCursorBase.row);
    if (mode == SelectionModify) {
      selectCursor(this);
      return;
    }
  }
  return;
}

Assistant:

void PatternModel::moveCursorRow(int amount, SelectMode mode) {
    if (mPlaying && mFollowing) {
        return;
    }
    
    if (mode == SelectionModify) {
        selectCursor();
    } else if (mode == SelectionRemove) {
        deselect();
    }
    setCursorRow(mCursor.row + amount);
    if (mode == SelectionModify) {
        selectCursor();
    }
}